

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1506.c
# Opt level: O3

int test(char *URL)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  timeval tVar11;
  int running;
  CURL *curl [4];
  fd_set rd;
  fd_set exc;
  fd_set wr;
  char target_url [256];
  char dnsentry [256];
  int local_3f8;
  int local_3f4;
  char *local_3f0;
  timeval local_3e8;
  long local_3d8 [4];
  fd_set local_3b8;
  fd_set local_338;
  fd_set local_2b8;
  undefined1 local_238 [255];
  undefined1 local_139;
  undefined1 local_138 [264];
  
  pcVar9 = libtest_arg2;
  local_3d8[2] = 0;
  local_3d8[3] = 0;
  local_3d8[0] = 0;
  local_3d8[1] = 0;
  local_3f0 = libtest_arg3;
  iVar8 = 1;
  lVar2 = 0;
  do {
    lVar1 = lVar2;
    if (iVar8 == 5) {
      tv_test_start = tutil_tvnow();
      iVar8 = curl_global_init(3);
      uVar7 = _stderr;
      if (iVar8 != 0) {
        uVar3 = curl_easy_strerror(iVar8);
        curl_mfprintf(uVar7,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1506.c"
                      ,0x3e,iVar8,uVar3);
        goto LAB_001023f6;
      }
      lVar2 = curl_multi_init();
      if (lVar2 == 0) {
        lVar2 = 0;
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1506.c"
                      ,0x40);
        iVar8 = 0x7b;
        goto LAB_00102364;
      }
      iVar8 = curl_multi_setopt(lVar2,6,3);
      uVar7 = _stderr;
      if (iVar8 == 0) {
        lVar10 = 0;
        goto LAB_0010249e;
      }
      uVar3 = curl_multi_strerror(iVar8);
      pcVar9 = "%s:%d curl_multi_setopt() failed, with code %d (%s)\n";
      uVar6 = 0x42;
      goto LAB_00102458;
    }
    curl_msnprintf(local_138,0x100,"server%d.example.com:%s:%s",iVar8,local_3f0,pcVar9);
    curl_mprintf("%s\n",local_138);
    lVar2 = curl_slist_append(lVar1,local_138);
    iVar8 = iVar8 + 1;
  } while (lVar2 != 0);
  lVar2 = 0;
  curl_mfprintf(_stderr,"curl_slist_append() failed\n");
  iVar8 = 0;
  goto LAB_00102364;
  while( true ) {
    iVar8 = (int)lVar10 + 1;
    curl_msnprintf(local_238,0x100,"http://server%d.example.com:%s/path/1506%04i",iVar8,local_3f0,
                   iVar8);
    local_139 = 0;
    iVar8 = curl_easy_setopt(lVar4,0x2712,local_238);
    uVar7 = _stderr;
    if (iVar8 != 0) {
      uVar3 = curl_easy_strerror(iVar8);
      pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      uVar6 = 0x4d;
      goto LAB_00102458;
    }
    iVar8 = curl_easy_setopt(lVar4,0x29,1);
    uVar7 = _stderr;
    if (iVar8 != 0) {
      uVar3 = curl_easy_strerror(iVar8);
      pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      uVar6 = 0x4f;
      goto LAB_00102458;
    }
    iVar8 = curl_easy_setopt(lVar4,0x2a,1);
    uVar7 = _stderr;
    if (iVar8 != 0) {
      uVar3 = curl_easy_strerror(iVar8);
      pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      uVar6 = 0x51;
      goto LAB_00102458;
    }
    iVar8 = curl_easy_setopt(lVar4,0x27db,lVar1);
    uVar7 = _stderr;
    lVar10 = lVar10 + 1;
    if (iVar8 != 0) break;
LAB_0010249e:
    if (lVar10 == 4) {
      curl_mfprintf(_stderr,"Start at URL 0\n");
      pcVar9 = (char *)0x0;
      goto LAB_001025b7;
    }
    lVar4 = curl_easy_init();
    local_3d8[lVar10] = lVar4;
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1506.c"
                    ,0x47);
      iVar8 = 0x7c;
      goto LAB_00102364;
    }
  }
  uVar3 = curl_easy_strerror(iVar8);
  pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
  uVar6 = 0x53;
LAB_00102458:
  curl_mfprintf(uVar7,pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1506.c"
                ,uVar6,iVar8,uVar3);
  goto LAB_00102364;
code_r0x00102745:
  tVar11 = tutil_tvnow();
  lVar10 = tutil_tvdiff(tVar11,tv_test_start);
  if (60000 < lVar10) {
    uVar7 = 0x75;
LAB_00102978:
    curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1506.c"
                  ,uVar7);
    iVar8 = 0x7d;
    goto LAB_00102364;
  }
  goto LAB_001025d1;
LAB_001025b7:
  do {
    local_3f0 = pcVar9;
    iVar8 = curl_multi_add_handle(lVar2,local_3d8[(long)pcVar9]);
    uVar7 = _stderr;
    if (iVar8 != 0) {
      uVar3 = curl_multi_strerror(iVar8);
      pcVar9 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
      uVar6 = 0x5a;
      goto LAB_00102458;
    }
LAB_001025d1:
    local_3f8 = -99;
    local_3e8.tv_sec = 1;
    local_3e8.tv_usec = 0;
    iVar8 = curl_multi_perform(lVar2,&local_3f4);
    uVar7 = _stderr;
    if (iVar8 != 0) {
      uVar3 = curl_multi_strerror(iVar8);
      pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
      uVar6 = 100;
      goto LAB_00102458;
    }
    if (local_3f4 < 0) {
      pcVar9 = 
      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
      uVar7 = 100;
LAB_00102905:
      curl_mfprintf(_stderr,pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1506.c"
                    ,uVar7);
      iVar8 = 0x7a;
      break;
    }
    tVar11 = tutil_tvnow();
    lVar10 = tutil_tvdiff(tVar11,tv_test_start);
    if (60000 < lVar10) {
      uVar7 = 0x66;
      goto LAB_00102978;
    }
    if (local_3f4 != 0) {
      local_3b8.__fds_bits[0xe] = 0;
      local_3b8.__fds_bits[0xf] = 0;
      local_3b8.__fds_bits[0xc] = 0;
      local_3b8.__fds_bits[0xd] = 0;
      local_3b8.__fds_bits[10] = 0;
      local_3b8.__fds_bits[0xb] = 0;
      local_3b8.__fds_bits[8] = 0;
      local_3b8.__fds_bits[9] = 0;
      local_3b8.__fds_bits[6] = 0;
      local_3b8.__fds_bits[7] = 0;
      local_3b8.__fds_bits[4] = 0;
      local_3b8.__fds_bits[5] = 0;
      local_3b8.__fds_bits[2] = 0;
      local_3b8.__fds_bits[3] = 0;
      local_3b8.__fds_bits[0] = 0;
      local_3b8.__fds_bits[1] = 0;
      local_2b8.__fds_bits[0] = 0;
      local_2b8.__fds_bits[1] = 0;
      local_2b8.__fds_bits[2] = 0;
      local_2b8.__fds_bits[3] = 0;
      local_2b8.__fds_bits[4] = 0;
      local_2b8.__fds_bits[5] = 0;
      local_2b8.__fds_bits[6] = 0;
      local_2b8.__fds_bits[7] = 0;
      local_2b8.__fds_bits[8] = 0;
      local_2b8.__fds_bits[9] = 0;
      local_2b8.__fds_bits[10] = 0;
      local_2b8.__fds_bits[0xb] = 0;
      local_2b8.__fds_bits[0xc] = 0;
      local_2b8.__fds_bits[0xd] = 0;
      local_2b8.__fds_bits[0xe] = 0;
      local_2b8.__fds_bits[0xf] = 0;
      local_338.__fds_bits[0] = 0;
      local_338.__fds_bits[1] = 0;
      local_338.__fds_bits[2] = 0;
      local_338.__fds_bits[3] = 0;
      local_338.__fds_bits[4] = 0;
      local_338.__fds_bits[5] = 0;
      local_338.__fds_bits[6] = 0;
      local_338.__fds_bits[7] = 0;
      local_338.__fds_bits[8] = 0;
      local_338.__fds_bits[9] = 0;
      local_338.__fds_bits[10] = 0;
      local_338.__fds_bits[0xb] = 0;
      local_338.__fds_bits[0xc] = 0;
      local_338.__fds_bits[0xd] = 0;
      local_338.__fds_bits[0xe] = 0;
      local_338.__fds_bits[0xf] = 0;
      iVar8 = curl_multi_fdset(lVar2,&local_3b8,&local_2b8,&local_338,&local_3f8);
      uVar7 = _stderr;
      if (iVar8 == 0) {
        if (local_3f8 < -1) {
          pcVar9 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
          uVar7 = 0x6f;
          goto LAB_00102905;
        }
        iVar8 = select_wrapper(local_3f8 + 1,&local_3b8,&local_2b8,&local_338,&local_3e8);
        if (iVar8 != -1) goto code_r0x00102745;
        piVar5 = __errno_location();
        uVar7 = _stderr;
        iVar8 = *piVar5;
        pcVar9 = strerror(iVar8);
        curl_mfprintf(uVar7,"%s:%d select() failed, with errno %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1506.c"
                      ,0x73,iVar8,pcVar9);
        iVar8 = 0x79;
        break;
      }
      uVar3 = curl_multi_strerror(iVar8);
      pcVar9 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
      uVar6 = 0x6f;
      goto LAB_00102458;
    }
    wait_ms(1);
    pcVar9 = local_3f0 + 1;
    iVar8 = 0;
  } while (pcVar9 != (char *)0x4);
LAB_00102364:
  lVar10 = 0;
  do {
    lVar4 = local_3d8[lVar10];
    curl_multi_remove_handle(lVar2,lVar4);
    curl_easy_cleanup(lVar4);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  curl_slist_free_all(lVar1);
  curl_multi_cleanup(lVar2);
  curl_global_cleanup();
LAB_001023f6:
  return iVar8;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES] = {0};
  int running;
  CURLM *m = NULL;
  int i;
  char target_url[256];
  char dnsentry[256];
  struct curl_slist *slist = NULL, *slist2;
  char *port = libtest_arg3;
  char *address = libtest_arg2;

  (void)URL;

  /* Create fake DNS entries for serverX.example.com for all handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    snprintf(dnsentry, sizeof(dnsentry), "server%d.example.com:%s:%s",
             i + 1, port, address);
    printf("%s\n", dnsentry);
    slist2 = curl_slist_append(slist, dnsentry);
    if(!slist2) {
      fprintf(stderr, "curl_slist_append() failed\n");
      goto test_cleanup;
    }
    slist = slist2;
  }

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  multi_setopt(m, CURLMOPT_MAXCONNECTS, 3L);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    snprintf(target_url, sizeof(target_url),
             "http://server%d.example.com:%s/path/1506%04i",
             i + 1, port, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);

    easy_setopt(curl[i], CURLOPT_RESOLVE, slist);
  }

  fprintf(stderr, "Start at URL 0\n");

  for(i = 0; i < NUM_HANDLES; i++) {
    /* add handle to multi */
    multi_add_handle(m, curl[i]);

    for(;;) {
      struct timeval interval;
      fd_set rd, wr, exc;
      int maxfd = -99;

      interval.tv_sec = 1;
      interval.tv_usec = 0;

      multi_perform(m, &running);

      abort_on_test_timeout();

      if(!running)
        break; /* done */

      FD_ZERO(&rd);
      FD_ZERO(&wr);
      FD_ZERO(&exc);

      multi_fdset(m, &rd, &wr, &exc, &maxfd);

      /* At this point, maxfd is guaranteed to be greater or equal than -1. */

      select_test(maxfd + 1, &rd, &wr, &exc, &interval);

      abort_on_test_timeout();
    }
    wait_ms(1); /* to ensure different end times */
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }

  curl_slist_free_all(slist);

  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}